

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::genBlockSource_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          deInt64 numSSBlocks,GLenum shaderType)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  ostream *poVar3;
  ostringstream *poVar4;
  int iVar5;
  ostringstream source;
  
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar4 = &source;
  poVar3 = std::operator<<(&poVar4->super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  pcVar2 = glcts::fixed_sample_locations_values + 1;
  iVar5 = (int)numSSBlocks;
  if (!bVar1) {
    if (iVar5 - 0x8e87U < 2) {
      pcVar2 = "#extension GL_EXT_tessellation_shader : require\n";
    }
    else if (iVar5 == 0x8dd9) {
      pcVar2 = "#extension GL_EXT_geometry_shader : require\n";
    }
  }
  std::operator<<(poVar3,pcVar2);
  if (iVar5 == 0x8dd9) {
    poVar4 = (ostringstream *)
             std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                             "layout(points) in;\n");
    pcVar2 = "layout(line_strip, max_vertices = 3) out;\n";
  }
  else if (iVar5 == 0x8e87) {
    pcVar2 = "layout(triangles) in;\n";
  }
  else if (iVar5 == 0x8e88) {
    pcVar2 = "layout(vertices = 10) out;\n";
  }
  else {
    if (iVar5 != 0x91b9) goto LAB_013a7f2a;
    pcVar2 = "layout (local_size_x = 1) in;\n";
  }
  std::operator<<(&poVar4->super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
LAB_013a7f2a:
  poVar3 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  poVar3 = std::operator<<(poVar3,"layout(std430, binding = 0) buffer Block {\n");
  poVar3 = std::operator<<(poVar3,"    int value;\n");
  poVar3 = std::operator<<(poVar3,"} sb_in[");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3,"];\n");
  std::operator<<(poVar3,"void main(void) { sb_in[0].value = 1; }\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  return __return_storage_ptr__;
}

Assistant:

std::string genBlockSource (NegativeTestContext& ctx, deInt64 numSSBlocks, glw::GLenum shaderType)
{
	const bool				isES32		= contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version		= isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	std::ostringstream		source;

	source	<< glu::getGLSLVersionDeclaration(version) << "\n"
			<< ((isES32) ? "" : getShaderExtensionDeclaration(shaderType));

	switch (shaderType)
	{
		case GL_VERTEX_SHADER:
		case GL_FRAGMENT_SHADER:
			break;

		case GL_COMPUTE_SHADER:
			source << "layout (local_size_x = 1) in;\n";
			break;

		case GL_GEOMETRY_SHADER:
			source << "layout(points) in;\n"
				   << "layout(line_strip, max_vertices = 3) out;\n";
			break;

		case GL_TESS_CONTROL_SHADER:
			source << "layout(vertices = 10) out;\n";
			break;

		case GL_TESS_EVALUATION_SHADER:
			source << "layout(triangles) in;\n";
			break;

		default:
			DE_FATAL("Unknown shader type");
			break;
	}

	source  << "\n"
			<< "layout(std430, binding = 0) buffer Block {\n"
			<< "    int value;\n"
			<< "} sb_in[" << numSSBlocks << "];\n"
			<< "void main(void) { sb_in[0].value = 1; }\n";

	return source.str();
}